

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O2

void NULLC::AutoArraySet(NULLCRef x,uint pos,NULLCAutoArray *arr)

{
  uint uVar1;
  ExternTypeInfo *pEVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  NULLCAutoArray local_38;
  
  if (arr == (NULLCAutoArray *)0x0) {
    nullcThrowError("ERROR: null pointer access");
    return;
  }
  if (x.typeID == arr->typeID) {
    pEVar2 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),x.typeID);
    uVar1 = pEVar2->size;
    uVar5 = arr->len;
    if (uVar5 <= pos) {
      uVar5 = uVar5 + (uVar5 >> 1) + 1;
      if (uVar5 <= pos) {
        uVar5 = pos;
      }
      AutoArray(&local_38,arr->typeID,uVar5);
      if ((void *)CONCAT44(local_38.ptr._4_4_,local_38.ptr._0_4_) == (void *)0x0) {
        return;
      }
      memcpy((void *)CONCAT44(local_38.ptr._4_4_,local_38.ptr._0_4_),arr->ptr,
             (ulong)(arr->len * uVar1));
      *(ulong *)arr = CONCAT44(local_38.ptr._0_4_,local_38.typeID);
      *(ulong *)((long)&arr->ptr + 4) = CONCAT44(local_38.len,local_38.ptr._4_4_);
    }
    memcpy(arr->ptr + pos * uVar1,x.ptr,(ulong)uVar1);
    return;
  }
  pcVar3 = nullcGetTypeName(x.typeID);
  pcVar4 = nullcGetTypeName(arr->typeID);
  nullcThrowError("ERROR: cannot convert from \'%s\' to an \'auto[]\' element type \'%s\'",pcVar3,
                  pcVar4);
  return;
}

Assistant:

void NULLC::AutoArraySet(NULLCRef x, unsigned pos, NULLCAutoArray* arr)
{
	if(!arr)
	{
		nullcThrowError("ERROR: null pointer access");
		return;
	}
	if(x.typeID != arr->typeID)
	{
		nullcThrowError("ERROR: cannot convert from '%s' to an 'auto[]' element type '%s'", nullcGetTypeName(x.typeID), nullcGetTypeName(arr->typeID));
		return;
	}

	unsigned elemSize = linker->exTypes[arr->typeID].size;
	if(pos >= arr->len)
	{
		unsigned newSize = 1 + arr->len + (arr->len >> 1);
		if(pos >= newSize)
			newSize = pos;
		NULLCAutoArray n;
		AutoArray(&n, arr->typeID, newSize);
		if(!n.ptr)
			return;
		memcpy(n.ptr, arr->ptr, unsigned(arr->len * elemSize));
		*arr = n;
	}
	memcpy(arr->ptr + elemSize * pos, x.ptr, elemSize);
}